

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O3

void __thiscall
ON_ClippingPlaneDataStore::ON_ClippingPlaneDataStore
          (ON_ClippingPlaneDataStore *this,ON_ClippingPlaneDataStore *src)

{
  ON_ClippingPlaneData *pOVar1;
  ON_ClippingPlaneData *pOVar2;
  
  this->m_sn = 0;
  pOVar1 = GetClippingPlaneData(src->m_sn);
  if (pOVar1 != (ON_ClippingPlaneData *)0x0) {
    pOVar2 = GetClippingPlaneData(this,SUB81(src,0));
    if (pOVar2 != (ON_ClippingPlaneData *)0x0) {
      pOVar2->m_depth = pOVar1->m_depth;
      ON_UuidList::operator=(&pOVar2->m_object_id_list,&pOVar1->m_object_id_list);
      pOVar2->m_is_exclusion_list = pOVar1->m_is_exclusion_list;
      ON_SimpleArray<int>::operator=(&pOVar2->m_layer_list,&pOVar1->m_layer_list);
      pOVar2->m_layer_list_is_sorted = pOVar1->m_layer_list_is_sorted;
    }
  }
  return;
}

Assistant:

ON_ClippingPlaneDataStore::ON_ClippingPlaneDataStore(const ON_ClippingPlaneDataStore& src)
{
  ON_ClippingPlaneData* srcData = GetClippingPlaneData(src.m_sn);
  if (srcData)
  {
    ON_ClippingPlaneData* thisData = GetClippingPlaneData(*this, true);
    if (thisData)
    {
      thisData->m_depth = srcData->m_depth;
      thisData->m_object_id_list = srcData->m_object_id_list;
      thisData->m_is_exclusion_list = srcData->m_is_exclusion_list;
      thisData->m_layer_list = srcData->m_layer_list;
      thisData->m_layer_list_is_sorted = srcData->m_layer_list_is_sorted;
    }
  }
  
}